

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O2

MPP_RET dec_vproc_set_dei_v1(MppDecVprocCtx *vproc_ctx,MppFrame frm)

{
  Mpp *mpp;
  MppBuffer buffer;
  RK_U32 RVar1;
  uint uVar2;
  MPP_RET MVar3;
  int iVar4;
  RK_U32 RVar5;
  MppBuffer buffer_00;
  IepCap_t *cap;
  IepImg img;
  
  mpp = (Mpp *)*vproc_ctx;
  RVar1 = mpp_frame_get_mode(frm);
  mpp_frame_get_buffer(frm);
  buffer = vproc_ctx[0x17];
  dec_vproc_set_img_fmt(&img,frm);
  uVar2 = (**(code **)(*vproc_ctx[10] + 0x10))(vproc_ctx[9],0,0);
  if (uVar2 != 0) {
    _mpp_log_l(4,"mpp_dec_vproc","IEP_CMD_INIT failed %d\n","dec_vproc_set_dei_v1",(ulong)uVar2);
  }
  MVar3 = (**(code **)(*vproc_ctx[10] + 0x10))(vproc_ctx[9],0x8000);
  if (MVar3 != MPP_OK) {
    _mpp_log_l(4,"mpp_dec_vproc","IEP_CMD_QUERY_CAP failed %d\n","dec_vproc_set_dei_v1",
               (ulong)(uint)MVar3);
  }
  if (((byte)vproc_debug & 2) != 0) {
    _mpp_log_l(4,"mpp_dec_vproc","2 field in and 1 frame out\n","dec_vproc_set_dei_v1");
  }
  buffer_00 = mpp_frame_get_buffer(frm);
  iVar4 = mpp_buffer_get_fd_with_caller(buffer_00,"dec_vproc_set_dei_v1");
  uVar2 = 1;
  dec_vproc_set_img((MppDecVprocCtxImpl *)vproc_ctx,&img,iVar4,IEP_CMD_SET_SRC);
  RVar5 = mpp_frame_get_errinfo(frm);
  if (RVar5 == 0) {
    RVar5 = mpp_frame_get_discard(frm);
    uVar2 = (uint)(RVar5 != 0);
  }
  if ((buffer == (MppBuffer)0x0) &&
     (_mpp_log_l(2,"mpp_dec_vproc","Assertion %s failed at %s:%d\n",(char *)0x0,"dst0",
                 "dec_vproc_set_dei_v1",0x158), (mpp_debug._3_1_ & 0x10) != 0)) {
    abort();
  }
  iVar4 = mpp_buffer_get_fd_with_caller(buffer,"dec_vproc_set_dei_v1");
  dec_vproc_set_img((MppDecVprocCtxImpl *)vproc_ctx,&img,iVar4,IEP_CMD_SET_DST);
  *(undefined4 *)(vproc_ctx + 0xb) = 1;
  mpp_frame_set_mode(frm,RVar1 | 0x100);
  (*(code *)vproc_ctx[0x1b])(vproc_ctx,RVar1 | 0x100);
  dec_vproc_put_frame(mpp,frm,buffer,-1,uVar2);
  vproc_ctx[0x17] = (MppDecVprocCtx)0x0;
  return MVar3;
}

Assistant:

static MPP_RET dec_vproc_set_dei_v1(MppDecVprocCtx *vproc_ctx, MppFrame frm)
{
    MPP_RET ret = MPP_OK;
    IepImg img;
    MppDecVprocCtxImpl *ctx = (MppDecVprocCtxImpl *)vproc_ctx;

    Mpp *mpp = ctx->mpp;
    RK_U32 mode = mpp_frame_get_mode(frm);
    MppBuffer buf = mpp_frame_get_buffer(frm);
    MppBuffer dst0 = ctx->out_buf0;
    MppBuffer dst1 = ctx->out_buf1;
    int fd = -1;
    RK_U32 frame_err = 0;

    // setup source IepImg
    dec_vproc_set_img_fmt(&img, frm);

    ret = ctx->com_ctx->ops->control(ctx->iep_ctx, IEP_CMD_INIT, NULL);
    if (ret)
        mpp_log_f("IEP_CMD_INIT failed %d\n", ret);

    IepCap_t *cap = NULL;
    ret = ctx->com_ctx->ops->control(ctx->iep_ctx, IEP_CMD_QUERY_CAP, &cap);
    if (ret)
        mpp_log_f("IEP_CMD_QUERY_CAP failed %d\n", ret);

    // setup destination IepImg with new buffer
    // NOTE: when deinterlace is enabled parser thread will reserve
    //       more buffer than normal case
    if (ctx->prev_frm0 && cap && cap->i4_deinterlace_supported) {
        // 4 in 2 out case
        vproc_dbg_status("4 field in and 2 frame out\n");
        RK_S64 prev_pts = mpp_frame_get_pts(ctx->prev_frm0);
        RK_S64 curr_pts = mpp_frame_get_pts(frm);
        RK_S64 first_pts = (prev_pts + curr_pts) / 2;

        buf = mpp_frame_get_buffer(ctx->prev_frm0);
        fd = mpp_buffer_get_fd(buf);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_SRC);
        frame_err = mpp_frame_get_errinfo(ctx->prev_frm0) ||
                    mpp_frame_get_discard(ctx->prev_frm0);
        // setup dst 0
        mpp_assert(dst0);
        fd = mpp_buffer_get_fd(dst0);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DST);

        buf = mpp_frame_get_buffer(frm);
        fd = mpp_buffer_get_fd(buf);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DEI_SRC1);
        frame_err |= mpp_frame_get_errinfo(frm) ||
                     mpp_frame_get_discard(frm);
        // setup dst 1
        mpp_assert(dst1);
        fd = mpp_buffer_get_fd(dst1);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DEI_DST1);

        ctx->dei_cfg.dei_mode = IEP_DEI_MODE_I4O2;

        mode = mode | MPP_FRAME_FLAG_IEP_DEI_I4O2;
        mpp_frame_set_mode(frm, mode);

        // start hardware
        ctx->start_dei((MppDecVprocCtx *)ctx, mode);

        // NOTE: we need to process pts here
        if (mode & MPP_FRAME_FLAG_TOP_FIRST) {
            dec_vproc_put_frame(mpp, frm, dst0, first_pts, frame_err);
            dec_vproc_put_frame(mpp, frm, dst1, curr_pts, frame_err);
        } else {
            dec_vproc_put_frame(mpp, frm, dst1, first_pts, frame_err);
            dec_vproc_put_frame(mpp, frm, dst0, curr_pts, frame_err);
        }
        ctx->out_buf0 = NULL;
        ctx->out_buf1 = NULL;
    } else {
        // 2 in 1 out case
        vproc_dbg_status("2 field in and 1 frame out\n");
        buf = mpp_frame_get_buffer(frm);
        fd = mpp_buffer_get_fd(buf);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_SRC);
        frame_err = mpp_frame_get_errinfo(frm) ||
                    mpp_frame_get_discard(frm);

        // setup dst 0
        mpp_assert(dst0);
        fd = mpp_buffer_get_fd(dst0);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DST);

        ctx->dei_cfg.dei_mode = IEP_DEI_MODE_I2O1;
        mode = mode | MPP_FRAME_FLAG_IEP_DEI_I2O1;
        mpp_frame_set_mode(frm, mode);

        // start hardware
        ctx->start_dei((MppDecVprocCtx *)ctx, mode);
        dec_vproc_put_frame(mpp, frm, dst0, -1, frame_err);
        ctx->out_buf0 = NULL;
    }

    return ret;
}